

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct16_stage6_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  __m128i alVar1;
  __m128i alVar2;
  int in_XMM0_Da;
  int in_XMM0_Db;
  int in_XMM0_Dc;
  int in_XMM0_Dd;
  undefined1 auVar3 [16];
  __m128i alVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  __m128i alVar21;
  undefined1 auVar22 [16];
  __m128i alVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  alVar4 = *x;
  alVar21 = x[1];
  alVar1 = x[2];
  alVar2 = x[3];
  alVar23 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[7]);
  *x = alVar23;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[7]);
  x[7] = alVar4;
  alVar4 = (__m128i)paddsw((undefined1  [16])alVar21,(undefined1  [16])x[6]);
  x[1] = alVar4;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar21,(undefined1  [16])x[6]);
  x[6] = alVar4;
  alVar4 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[5]);
  x[2] = alVar4;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[5]);
  x[5] = alVar4;
  alVar4 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])x[4]);
  x[3] = alVar4;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])x[4]);
  x[4] = alVar4;
  alVar4 = x[10];
  auVar5._0_12_ = alVar4._0_12_;
  auVar5._12_2_ = alVar4[0]._6_2_;
  auVar5._14_2_ = *(undefined2 *)((long)x[0xd] + 6);
  auVar24._12_4_ = auVar5._12_4_;
  auVar24._0_10_ = alVar4._0_10_;
  auVar24._10_2_ = *(undefined2 *)((long)x[0xd] + 4);
  auVar19._10_6_ = auVar24._10_6_;
  auVar19._0_8_ = alVar4[0];
  auVar19._8_2_ = alVar4[0]._4_2_;
  auVar14._8_8_ = auVar19._8_8_;
  auVar14._6_2_ = *(undefined2 *)((long)x[0xd] + 2);
  auVar14._4_2_ = alVar4[0]._2_2_;
  auVar14._0_2_ = (undefined2)alVar4[0];
  auVar14._2_2_ = (short)x[0xd][0];
  auVar13._2_2_ = (short)x[0xd][1];
  auVar13._0_2_ = (short)alVar4[1];
  auVar13._4_2_ = alVar4[1]._2_2_;
  auVar13._6_2_ = *(undefined2 *)((long)x[0xd] + 10);
  auVar13._8_2_ = alVar4[1]._4_2_;
  auVar13._10_2_ = *(undefined2 *)((long)x[0xd] + 0xc);
  auVar13._12_2_ = alVar4[1]._6_2_;
  auVar13._14_2_ = *(undefined2 *)((long)x[0xd] + 0xe);
  auVar3._8_4_ = 0xb50f4b0;
  auVar3._0_8_ = 0xb50f4b00b50f4b0;
  auVar3._12_4_ = 0xb50f4b0;
  auVar19 = pmaddwd(auVar14,auVar3);
  auVar24 = pmaddwd(auVar13,auVar3);
  auVar17._8_4_ = 0xb500b50;
  auVar17._0_8_ = 0xb500b500b500b50;
  auVar17._12_4_ = 0xb500b50;
  auVar6 = pmaddwd(auVar14,auVar17);
  auVar14 = pmaddwd(auVar13,auVar17);
  auVar20._0_4_ = auVar19._0_4_ + in_XMM0_Da >> 0xc;
  auVar20._4_4_ = auVar19._4_4_ + in_XMM0_Db >> 0xc;
  auVar20._8_4_ = auVar19._8_4_ + in_XMM0_Dc >> 0xc;
  auVar20._12_4_ = auVar19._12_4_ + in_XMM0_Dd >> 0xc;
  auVar25._0_4_ = auVar24._0_4_ + in_XMM0_Da >> 0xc;
  auVar25._4_4_ = auVar24._4_4_ + in_XMM0_Db >> 0xc;
  auVar25._8_4_ = auVar24._8_4_ + in_XMM0_Dc >> 0xc;
  auVar25._12_4_ = auVar24._12_4_ + in_XMM0_Dd >> 0xc;
  alVar21 = (__m128i)packssdw(auVar20,auVar25);
  auVar7._0_4_ = auVar6._0_4_ + in_XMM0_Da >> 0xc;
  auVar7._4_4_ = auVar6._4_4_ + in_XMM0_Db >> 0xc;
  auVar7._8_4_ = auVar6._8_4_ + in_XMM0_Dc >> 0xc;
  auVar7._12_4_ = auVar6._12_4_ + in_XMM0_Dd >> 0xc;
  auVar15._0_4_ = auVar14._0_4_ + in_XMM0_Da >> 0xc;
  auVar15._4_4_ = auVar14._4_4_ + in_XMM0_Db >> 0xc;
  auVar15._8_4_ = auVar14._8_4_ + in_XMM0_Dc >> 0xc;
  auVar15._12_4_ = auVar14._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar7,auVar15);
  x[10] = alVar21;
  x[0xd] = alVar4;
  alVar4 = x[0xb];
  auVar11._0_12_ = alVar4._0_12_;
  auVar11._12_2_ = alVar4[0]._6_2_;
  auVar11._14_2_ = *(undefined2 *)((long)x[0xc] + 6);
  auVar10._12_4_ = auVar11._12_4_;
  auVar10._0_10_ = alVar4._0_10_;
  auVar10._10_2_ = *(undefined2 *)((long)x[0xc] + 4);
  auVar9._10_6_ = auVar10._10_6_;
  auVar9._0_8_ = alVar4[0];
  auVar9._8_2_ = alVar4[0]._4_2_;
  auVar8._8_8_ = auVar9._8_8_;
  auVar8._6_2_ = *(undefined2 *)((long)x[0xc] + 2);
  auVar8._4_2_ = alVar4[0]._2_2_;
  auVar8._0_2_ = (undefined2)alVar4[0];
  auVar8._2_2_ = (short)x[0xc][0];
  auVar16._2_2_ = (short)x[0xc][1];
  auVar16._0_2_ = (short)alVar4[1];
  auVar16._4_2_ = alVar4[1]._2_2_;
  auVar16._6_2_ = *(undefined2 *)((long)x[0xc] + 10);
  auVar16._8_2_ = alVar4[1]._4_2_;
  auVar16._10_2_ = *(undefined2 *)((long)x[0xc] + 0xc);
  auVar16._12_2_ = alVar4[1]._6_2_;
  auVar16._14_2_ = *(undefined2 *)((long)x[0xc] + 0xe);
  auVar6 = pmaddwd(auVar8,auVar3);
  auVar3 = pmaddwd(auVar3,auVar16);
  auVar14 = pmaddwd(auVar8,auVar17);
  auVar17 = pmaddwd(auVar16,auVar17);
  auVar22._0_4_ = auVar6._0_4_ + in_XMM0_Da >> 0xc;
  auVar22._4_4_ = auVar6._4_4_ + in_XMM0_Db >> 0xc;
  auVar22._8_4_ = auVar6._8_4_ + in_XMM0_Dc >> 0xc;
  auVar22._12_4_ = auVar6._12_4_ + in_XMM0_Dd >> 0xc;
  auVar6._0_4_ = auVar3._0_4_ + in_XMM0_Da >> 0xc;
  auVar6._4_4_ = auVar3._4_4_ + in_XMM0_Db >> 0xc;
  auVar6._8_4_ = auVar3._8_4_ + in_XMM0_Dc >> 0xc;
  auVar6._12_4_ = auVar3._12_4_ + in_XMM0_Dd >> 0xc;
  alVar21 = (__m128i)packssdw(auVar22,auVar6);
  auVar12._0_4_ = auVar14._0_4_ + in_XMM0_Da >> 0xc;
  auVar12._4_4_ = auVar14._4_4_ + in_XMM0_Db >> 0xc;
  auVar12._8_4_ = auVar14._8_4_ + in_XMM0_Dc >> 0xc;
  auVar12._12_4_ = auVar14._12_4_ + in_XMM0_Dd >> 0xc;
  auVar18._0_4_ = auVar17._0_4_ + in_XMM0_Da >> 0xc;
  auVar18._4_4_ = auVar17._4_4_ + in_XMM0_Db >> 0xc;
  auVar18._8_4_ = auVar17._8_4_ + in_XMM0_Dc >> 0xc;
  auVar18._12_4_ = auVar17._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar12,auVar18);
  x[0xb] = alVar21;
  x[0xc] = alVar4;
  return;
}

Assistant:

static inline void idct16_stage6_sse2(__m128i *x, const int32_t *cospi,
                                      const __m128i __rounding,
                                      int8_t cos_bit) {
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_sse2(x[0], x[7]);
  btf_16_adds_subs_sse2(x[1], x[6]);
  btf_16_adds_subs_sse2(x[2], x[5]);
  btf_16_adds_subs_sse2(x[3], x[4]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);
}